

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::
WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          size_t *nextreturnperiod_index,double *last_return_period,OASIS_FLOAT *last_loss,
          double current_return_period,OASIS_FLOAT current_loss,int summary_id,int eptype,int epcalc
          ,double max_retperiod,int counter,OASIS_FLOAT tvar,
          map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
          *tail,offset_in_aggreports_to_subr WriteOutput,
          map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
          *mean_map)

{
  int *piVar1;
  pointer piVar2;
  pointer pmVar3;
  ulong uVar4;
  code *pcVar5;
  mapped_type *pmVar6;
  aggreports *this_00;
  OASIS_FLOAT OVar7;
  aggreports *in_stack_00000038;
  int local_7c;
  OASIS_FLOAT local_78;
  float local_74;
  double local_70;
  aggreports *local_68;
  double local_60;
  double *local_58;
  OASIS_FLOAT *local_50;
  double local_48;
  vector<int,_std::allocator<int>_> *local_40;
  double local_38;
  
  local_68 = (aggreports *)((long)&this->totalperiods_ + (long)&mean_map->_M_t);
  uVar4 = *nextreturnperiod_index;
  this_00 = this;
  local_7c = summary_id;
  local_78 = current_loss;
  local_74 = tvar;
  local_60 = max_retperiod;
  local_58 = last_return_period;
  local_50 = last_loss;
  local_48 = current_return_period;
  local_40 = fileIDs;
  do {
    piVar2 = (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar2 >> 2) <= uVar4) {
      return;
    }
    local_70 = (double)piVar2[uVar4];
    if (local_70 < current_return_period) break;
    if (local_70 <= max_retperiod) {
      OVar7 = GetLoss(this_00,local_70,*local_58,*local_50,current_return_period,local_78);
      if (WriteOutput != 0) {
        pcVar5 = (code *)WriteOutput;
        if ((WriteOutput & 1) != 0) {
          pcVar5 = *(code **)(*(long *)local_68 + -1 + WriteOutput);
        }
        this_00 = local_68;
        (*pcVar5)(local_70,OVar7,local_68,local_40,local_7c,epcalc,eptype);
      }
      if (in_stack_00000038 != (aggreports *)0x0) {
        pmVar6 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)in_stack_00000038,&local_7c);
        (pmVar6->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
        super__Vector_impl_data._M_start[*nextreturnperiod_index].retperiod = local_70;
        local_38 = (double)OVar7;
        pmVar6 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)in_stack_00000038,&local_7c);
        pmVar3 = (pmVar6->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pmVar3[*nextreturnperiod_index].mean = local_38 + pmVar3[*nextreturnperiod_index].mean;
        this_00 = in_stack_00000038;
        pmVar6 = std::
                 map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                 ::operator[]((map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                               *)in_stack_00000038,&local_7c);
        piVar1 = &(pmVar6->super__Vector_base<mean_count,_std::allocator<mean_count>_>)._M_impl.
                  super__Vector_impl_data._M_start[*nextreturnperiod_index].count;
        *piVar1 = *piVar1 + 1;
      }
      if ((local_48 != 0.0) || (NAN(local_48))) {
        local_74 = local_74 - (local_74 - OVar7) / (float)counter;
        FillTVaR(this_00,tail,local_7c,epcalc,local_70,local_74);
      }
      uVar4 = *nextreturnperiod_index + 1;
      *nextreturnperiod_index = uVar4;
      counter = counter + 1;
      max_retperiod = local_60;
      current_return_period = local_48;
    }
    else {
      uVar4 = uVar4 + 1;
      *nextreturnperiod_index = uVar4;
    }
  } while (current_return_period <= local_70);
  if (0.0 < current_return_period) {
    *local_58 = current_return_period;
    *local_50 = local_78;
  }
  return;
}

Assistant:

void aggreports::WriteReturnPeriodOut(const std::vector<int> &fileIDs,
	size_t &nextreturnperiod_index, double &last_return_period,
	OASIS_FLOAT &last_loss, const double current_return_period,
	const OASIS_FLOAT current_loss, const int summary_id, const int eptype,
	const int epcalc, const double max_retperiod, int counter,
	OASIS_FLOAT tvar, T &tail,
	void (aggreports::*WriteOutput)(const std::vector<int>&, const int,
					const int, const int, const double,
					const OASIS_FLOAT),
	std::map<int, std::vector<mean_count>> *mean_map)
#endif
{

  double nextreturnperiod_value = 0;

  do {

    if (nextreturnperiod_index >= returnperiods_.size()) return;

    nextreturnperiod_value = returnperiods_[nextreturnperiod_index];

    if (current_return_period > nextreturnperiod_value) break;

    if (max_retperiod < nextreturnperiod_value) {
      nextreturnperiod_index++;
      continue;
    }

    OASIS_FLOAT loss = GetLoss(nextreturnperiod_value, last_return_period,
			       last_loss, current_return_period, current_loss);
    if (WriteOutput != nullptr) {
    	(this->*WriteOutput)(fileIDs, summary_id, epcalc, eptype,
			     nextreturnperiod_value, loss);
    }
    if (mean_map != nullptr) {   // Wheatsheaf Mean with period weights
      (*mean_map)[summary_id][nextreturnperiod_index].retperiod = nextreturnperiod_value;
      (*mean_map)[summary_id][nextreturnperiod_index].mean += loss;
      (*mean_map)[summary_id][nextreturnperiod_index].count++;
    }
#ifdef ORD_OUTPUT
    if (parquetFileNames_[EPT] != "") {
      WriteParquetOutput(os, summary_id, epcalc, eptype,
			 nextreturnperiod_value, loss);
    }
#endif

    // Tail Value at Risk makes no sense for return period = 0
    if (current_return_period != 0) {
      tvar = tvar - ((tvar - loss) / counter);
      FillTVaR(tail, summary_id, epcalc, nextreturnperiod_value, tvar);
    }

    nextreturnperiod_index++;
    counter++;

  } while (current_return_period <= nextreturnperiod_value);

  if (current_return_period > 0) {
    last_return_period = current_return_period;
    last_loss = current_loss;
  }

}